

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

_Bool al_wait_for_vsync(void)

{
  ALLEGRO_DISPLAY *pAVar1;
  ALLEGRO_DISPLAY *display;
  _Bool local_1;
  
  pAVar1 = al_get_current_display();
  if (pAVar1->vt->wait_for_vsync == (_func__Bool_ALLEGRO_DISPLAY_ptr *)0x0) {
    local_1 = false;
  }
  else {
    local_1 = (*pAVar1->vt->wait_for_vsync)(pAVar1);
  }
  return local_1;
}

Assistant:

bool al_wait_for_vsync(void)
{
   ALLEGRO_DISPLAY *display = al_get_current_display();
   ASSERT(display);

   if (display->vt->wait_for_vsync)
      return display->vt->wait_for_vsync(display);
   else
      return false;
}